

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::dht_put_mutable_item
          (session_impl *this,array<char,_32UL> key,
          function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *cb,string *salt)

{
  dht_tracker *this_00;
  _Manager_type p_Var1;
  pointer pcVar2;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  string local_b0;
  _Any_data local_90;
  code *local_80;
  _Bind<void_(*(std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>))(libtorrent::dht::item_&,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>)>
  local_70;
  public_key local_48;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_48.bytes._M_elems[0x10] = key._M_elems[0x10];
    local_48.bytes._M_elems[0x11] = key._M_elems[0x11];
    local_48.bytes._M_elems[0x12] = key._M_elems[0x12];
    local_48.bytes._M_elems[0x13] = key._M_elems[0x13];
    local_48.bytes._M_elems[0x14] = key._M_elems[0x14];
    local_48.bytes._M_elems[0x15] = key._M_elems[0x15];
    local_48.bytes._M_elems[0x16] = key._M_elems[0x16];
    local_48.bytes._M_elems[0x17] = key._M_elems[0x17];
    local_48.bytes._M_elems[0x18] = key._M_elems[0x18];
    local_48.bytes._M_elems[0x19] = key._M_elems[0x19];
    local_48.bytes._M_elems[0x1a] = key._M_elems[0x1a];
    local_48.bytes._M_elems[0x1b] = key._M_elems[0x1b];
    local_48.bytes._M_elems[0x1c] = key._M_elems[0x1c];
    local_48.bytes._M_elems[0x1d] = key._M_elems[0x1d];
    local_48.bytes._M_elems[0x1e] = key._M_elems[0x1e];
    local_48.bytes._M_elems[0x1f] = key._M_elems[0x1f];
    local_48.bytes._M_elems[0] = key._M_elems[0];
    local_48.bytes._M_elems[1] = key._M_elems[1];
    local_48.bytes._M_elems[2] = key._M_elems[2];
    local_48.bytes._M_elems[3] = key._M_elems[3];
    local_48.bytes._M_elems[4] = key._M_elems[4];
    local_48.bytes._M_elems[5] = key._M_elems[5];
    local_48.bytes._M_elems[6] = key._M_elems[6];
    local_48.bytes._M_elems[7] = key._M_elems[7];
    local_48.bytes._M_elems[8] = key._M_elems[8];
    local_48.bytes._M_elems[9] = key._M_elems[9];
    local_48.bytes._M_elems[10] = key._M_elems[10];
    local_48.bytes._M_elems[0xb] = key._M_elems[0xb];
    local_48.bytes._M_elems[0xc] = key._M_elems[0xc];
    local_48.bytes._M_elems[0xd] = key._M_elems[0xd];
    local_48.bytes._M_elems[0xe] = key._M_elems[0xe];
    local_48.bytes._M_elems[0xf] = key._M_elems[0xf];
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (code *)0x0;
    pcStack_c0 = (code *)0x0;
    local_d8._M_unused._M_object = operator_new(0x10);
    *(code **)local_d8._M_unused._0_8_ = anon_unknown_119::on_dht_put_mutable_item;
    *(alert_manager **)((long)local_d8._M_unused._0_8_ + 8) = &this->m_alerts;
    pcStack_c0 = ::std::
                 _Function_handler<void_(const_libtorrent::dht::item_&,_int),_std::_Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::alert_manager_&,_const_libtorrent::dht::item_&,_int)>_>
                 ::_M_invoke;
    local_c8 = ::std::
               _Function_handler<void_(const_libtorrent::dht::item_&,_int),_std::_Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::alert_manager_&,_const_libtorrent::dht::item_&,_int)>_>
               ::_M_manager;
    local_70._M_f = anon_unknown_119::put_mutable_callback;
    local_70._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_70._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor._8_8_ = 0;
    local_70._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
    local_70._M_bound_args.
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_head_impl._M_invoker = cb->_M_invoker;
    p_Var1 = (cb->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_70._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_head_impl.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
      local_70._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_head_impl.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
      (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
      cb->_M_invoker = (_Invoker_type)0x0;
      local_70._M_bound_args.
      super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      .
      super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_head_impl.super__Function_base._M_manager = p_Var1;
    }
    ::std::function<void(libtorrent::dht::item&)>::
    function<std::_Bind<void(*(std::_Placeholder<1>,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>))(libtorrent::dht::item&,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>)>,void>
              ((function<void(libtorrent::dht::item&)> *)local_90._M_pod_data,&local_70);
    pcVar2 = (salt->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + salt->_M_string_length);
    libtorrent::dht::dht_tracker::put_item
              (this_00,&local_48,(function<void_(const_libtorrent::dht::item_&,_int)> *)&local_d8,
               (function<void_(libtorrent::dht::item_&)> *)&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != (code *)0x0) {
      (*local_80)(&local_90,&local_90,__destroy_functor);
    }
    if (local_70._M_bound_args.
        super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        .
        super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        .
        super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
        ._M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_70._M_bound_args.
        super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        .
        super__Tuple_impl<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        .
        super__Head_base<1UL,_std::function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
        ._M_head_impl.super__Function_base._M_manager)
                ((_Any_data *)&local_70._M_bound_args,(_Any_data *)&local_70._M_bound_args,
                 __destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}